

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address.cpp
# Opt level: O2

TapBranchInfoStruct *
cfd::js::api::AddressStructApi::GetTapBranchInfo
          (TapBranchInfoStruct *__return_storage_ptr__,GetTapBranchInfoRequestStruct *request)

{
  string *in_R8;
  allocator local_159;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  function<cfd::js::api::TapBranchInfoStruct_(const_cfd::js::api::GetTapBranchInfoRequestStruct_&)>
  local_130;
  TapBranchInfoStruct local_110;
  
  TapBranchInfoStruct::TapBranchInfoStruct(__return_storage_ptr__);
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140 = std::
              _Function_handler<cfd::js::api::TapBranchInfoStruct_(const_cfd::js::api::GetTapBranchInfoRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_address.cpp:310:27)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<cfd::js::api::TapBranchInfoStruct_(const_cfd::js::api::GetTapBranchInfoRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_address.cpp:310:27)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_130,"GetTapBranchInfo",&local_159);
  ExecuteStructApi<cfd::js::api::GetTapBranchInfoRequestStruct,cfd::js::api::TapBranchInfoStruct>
            (&local_110,(api *)request,(GetTapBranchInfoRequestStruct *)&local_158,&local_130,in_R8)
  ;
  TapBranchInfoStruct::operator=(__return_storage_ptr__,&local_110);
  TapBranchInfoStruct::~TapBranchInfoStruct(&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::_Function_base::~_Function_base((_Function_base *)&local_158);
  return __return_storage_ptr__;
}

Assistant:

TapBranchInfoStruct AddressStructApi::GetTapBranchInfo(
    const GetTapBranchInfoRequestStruct& request) {
  static auto call_func = [](const GetTapBranchInfoRequestStruct& request)
      -> TapBranchInfoStruct {  // NOLINT
    TapBranchInfoStruct result;
    if (request.tree_string.empty()) {
      warn(CFD_LOG_SOURCE, "Failed to parameter. tree string is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "tree string is empty.");
    }
    TaprootScriptTree tree;
    TapBranch branch;
    TapBranch* branch_ptr;
    if (request.tapscript.empty()) {
      branch = TapBranch::FromString(request.tree_string);
      branch_ptr = &branch;
    } else {
      std::vector<ByteData256> nodes;
      for (const auto& node : request.nodes) {
        nodes.emplace_back(ByteData256(node));
      }
      tree = TaprootScriptTree::FromString(
          request.tree_string, Script(request.tapscript), nodes);
      branch_ptr = &tree;
    }

    auto branches = branch_ptr->GetBranchList();
    if (request.index >= static_cast<uint32_t>(branches.size())) {
      warn(CFD_LOG_SOURCE, "Failed to parameter. index is out of range.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "index is out of range.");
    }
    auto target_branch = branches[request.index];
    result.tree_string = target_branch.ToString();
    result.top_branch_hash = target_branch.GetCurrentBranchHash().GetHex();
    for (const auto& node : target_branch.GetNodeList()) {
      result.nodes.emplace_back(node.GetHex());
    }
    return result;
  };

  TapBranchInfoStruct result;
  result =
      ExecuteStructApi<GetTapBranchInfoRequestStruct, TapBranchInfoStruct>(
          request, call_func, std::string(__FUNCTION__));
  return result;
}